

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLNotationDecl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XMLNotationDecl::serialize(XMLNotationDecl *this,XSerializeEngine *serEng)

{
  XMLSize_t dummyDataLen;
  XMLSize_t dummyBufferLen;
  XMLSize_t local_20;
  XMLSize_t local_18;
  
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::readSize(serEng,&this->fId);
    XSerializeEngine::operator>>(serEng,&this->fNameSpaceId);
    XSerializeEngine::readString(serEng,&this->fName,&local_18,&local_20,false);
    XSerializeEngine::readString(serEng,&this->fPublicId,&local_18,&local_20,false);
    XSerializeEngine::readString(serEng,&this->fSystemId,&local_18,&local_20,false);
    XSerializeEngine::readString(serEng,&this->fBaseURI,&local_18,&local_20,false);
    return;
  }
  XSerializeEngine::writeSize(serEng,this->fId);
  XSerializeEngine::operator<<(serEng,this->fNameSpaceId);
  XSerializeEngine::writeString(serEng,this->fName,0,false);
  XSerializeEngine::writeString(serEng,this->fPublicId,0,false);
  XSerializeEngine::writeString(serEng,this->fSystemId,0,false);
  XSerializeEngine::writeString(serEng,this->fBaseURI,0,false);
  return;
}

Assistant:

void XMLNotationDecl::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {
        serEng.writeSize (fId);
        serEng<<fNameSpaceId;
        serEng.writeString(fName);
        serEng.writeString(fPublicId);
        serEng.writeString(fSystemId);
        serEng.writeString(fBaseURI);
    }
    else
    {
        serEng.readSize (fId);
        serEng>>fNameSpaceId;
        serEng.readString(fName);
        serEng.readString(fPublicId);
        serEng.readString(fSystemId);
        serEng.readString(fBaseURI);
    }
}